

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_descriptor_wsh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  int iVar2;
  size_t child_write_len;
  uchar output [34];
  ulong local_50;
  uchar local_48 [48];
  
  local_50 = *write_len;
  iVar2 = -2;
  iVar1 = iVar2;
  if (((0x21 < script_len && node->child != (miniscript_node_t *)0x0) &&
      (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
       (iVar1 = generate_script_from_miniscript
                          (node->child,node,derive_child_num,script,script_len,&local_50),
       iVar1 == 0)))) &&
     ((iVar1 = iVar2, local_50 < 0x209 &&
      (iVar1 = wally_witness_program_from_bytes(script,local_50,2,local_48,0x22,write_len),
      iVar1 == 0)))) {
    memcpy(script,local_48,*write_len);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int generate_by_descriptor_wsh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    unsigned char output[WALLY_SCRIPTPUBKEY_P2WSH_LEN];

    if (!node->child || (script_len < sizeof(output)) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, script, script_len, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    ret = wally_witness_program_from_bytes(script, child_write_len, WALLY_SCRIPT_SHA256, output, WALLY_SCRIPTPUBKEY_P2WSH_LEN, write_len);
    if (ret == WALLY_OK)
        memcpy(script, output, *write_len);

    return ret;
}